

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O1

EulerAngles *
AML::dcm2EulerAngles(EulerAngles *__return_storage_ptr__,Matrix33 *dcm,EulerSequence seq)

{
  bool bVar1;
  
  bVar1 = isValidDCM(dcm,0.0001);
  if (bVar1) {
    switch(seq) {
    case ZXZ:
      dcm2EulerAngles_ZXZ(__return_storage_ptr__,dcm);
      break;
    case XYX:
      dcm2EulerAngles_XYX(__return_storage_ptr__,dcm);
      break;
    case YZY:
      dcm2EulerAngles_YZY(__return_storage_ptr__,dcm);
      break;
    case ZYZ:
      dcm2EulerAngles_ZYZ(__return_storage_ptr__,dcm);
      break;
    case XZX:
      dcm2EulerAngles_XZX(__return_storage_ptr__,dcm);
      break;
    case YXY:
      dcm2EulerAngles_YXY(__return_storage_ptr__,dcm);
      break;
    case XYZ:
      dcm2EulerAngles_XYZ(__return_storage_ptr__,dcm);
      break;
    case YZX:
      dcm2EulerAngles_YZX(__return_storage_ptr__,dcm);
      break;
    case ZXY:
      dcm2EulerAngles_ZXY(__return_storage_ptr__,dcm);
      break;
    case XZY:
      dcm2EulerAngles_XZY(__return_storage_ptr__,dcm);
      break;
    case ZYX:
      dcm2EulerAngles_ZYX(__return_storage_ptr__,dcm);
      break;
    case YXZ:
      dcm2EulerAngles_YXZ(__return_storage_ptr__,dcm);
      break;
    default:
      goto switchD_00103089_default;
    }
  }
  else {
switchD_00103089_default:
    __return_storage_ptr__->phi = 0.0;
    __return_storage_ptr__->theta = 0.0;
    __return_storage_ptr__->psi = 0.0;
    __return_storage_ptr__->seq_ = XYZ;
  }
  return __return_storage_ptr__;
}

Assistant:

EulerAngles dcm2EulerAngles(const Matrix33& dcm, const EulerAngles::EulerSequence seq)
    {
        const double TOL = 0.0001;

        if (isValidDCM(dcm, TOL))
        {
            switch (seq)
            {
            case EulerAngles::EulerSequence::XYZ:
                return dcm2EulerAngles_XYZ(dcm);
            case EulerAngles::EulerSequence::ZXZ:
                return dcm2EulerAngles_ZXZ(dcm);
            case EulerAngles::EulerSequence::XYX:
                return dcm2EulerAngles_XYX(dcm);
            case EulerAngles::EulerSequence::YZY:
                return dcm2EulerAngles_YZY(dcm);
            case EulerAngles::EulerSequence::ZYZ:
                return dcm2EulerAngles_ZYZ(dcm);
            case EulerAngles::EulerSequence::XZX:
                return dcm2EulerAngles_XZX(dcm);
            case EulerAngles::EulerSequence::YXY:
                return dcm2EulerAngles_YXY(dcm);
            case EulerAngles::EulerSequence::YZX:
                return dcm2EulerAngles_YZX(dcm);
            case EulerAngles::EulerSequence::ZXY:
                return dcm2EulerAngles_ZXY(dcm);
            case EulerAngles::EulerSequence::XZY:
                return dcm2EulerAngles_XZY(dcm);
            case EulerAngles::EulerSequence::ZYX:
                return dcm2EulerAngles_ZYX(dcm);
            case EulerAngles::EulerSequence::YXZ:
                return dcm2EulerAngles_YXZ(dcm);
            }
        }
        return EulerAngles();
    }